

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void IOCall(item *x,item *y)

{
  long lVar1;
  int iVar2;
  typeDesc *ptVar3;
  instrStruct *piVar4;
  int iVar5;
  int b;
  int op;
  char *msg;
  
  ptVar3 = getType(y->typeIndex);
  switch(x->a) {
  case 0:
    if (ptVar3->index != charTypeIndex) {
      msg = "not a char in writeChar";
      goto LAB_0010782c;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar2 = y->r;
    iVar5 = 0x37;
    goto LAB_001075c6;
  case 1:
    if (ptVar3->index != intTypeIndex) {
      msg = "not an int in writeInt";
      goto LAB_0010782c;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar2 = y->r;
    iVar5 = 0x38;
LAB_001075c6:
    put(iVar5,0,0,iVar2);
    iVar2 = y->r;
    break;
  case 2:
    lVar1 = (long)bigNum;
    piVar4 = (instrStruct *)calloc(1,0x10);
    piVar4->instr = (uint)(4 % lVar1) | 0xcb800000;
    piVar4->next = lastInstr->next;
    lastInstr->next = piVar4;
    pc = pc + 1;
    lastInstr = piVar4;
    iVar2 = getReg();
    if (ptVar3->form == 0x322) {
      if (y->hs == 0) {
        iVar5 = y->a;
        b = y->r;
        op = 0x3a;
        goto LAB_00107785;
      }
      iVar2 = getReg();
      iVar5 = y->hs;
      lVar1 = (long)bigNum;
      piVar4 = (instrStruct *)calloc(1,0x10);
      piVar4->instr = (iVar5 << 0x15 | (uint)(3 % lVar1)) + 0xa0000000;
      piVar4->next = lastInstr->next;
      lastInstr->next = piVar4;
      pc = pc + 1;
      lastInstr = piVar4;
      put(0x3a,iVar2,y->r,y->a);
      lVar1 = (long)bigNum;
      piVar4 = (instrStruct *)calloc(1,0x10);
      piVar4->instr = (uint)(2 % lVar1) | 0xa0000000;
      piVar4->next = lastInstr->next;
      lastInstr->next = piVar4;
      pc = pc + 1;
      lastInstr = piVar4;
      put(0x39,iVar2,y->r,y->a);
      regs[x->hs] = 0;
    }
    else {
      if (ptVar3->form != 0x327) {
        msg = "bad type in fopen";
        goto LAB_0010782c;
      }
      iVar5 = y->a;
      b = y->r;
      op = 0x39;
LAB_00107785:
      put(op,iVar2,b,iVar5);
    }
    piVar4 = (instrStruct *)calloc(1,0x10);
    piVar4->instr = iVar2 * 0x200000 + -0x2fe40000;
    piVar4->next = lastInstr->next;
    lastInstr->next = piVar4;
    pc = pc + 1;
    lastInstr = piVar4;
    regs[y->r] = 0;
    break;
  case 3:
    ptVar3 = getType(fileTypeIndex);
    if (ptVar3->refIndex != y->typeIndex) {
      msg = "not a file type in fclose";
      goto LAB_0010782c;
    }
    iVar2 = getReg();
    put(0x20,iVar2,y->r,y->a);
    piVar4 = (instrStruct *)calloc(1,0x10);
    piVar4->instr = iVar2 * 0x210000 + -0x34000000;
    piVar4->next = lastInstr->next;
    lastInstr->next = piVar4;
    pc = pc + 1;
    iVar5 = 0x3b;
    lastInstr = piVar4;
    goto LAB_00107643;
  case 4:
    ptVar3 = getType(fileTypeIndex);
    if (ptVar3->refIndex != y->typeIndex) {
LAB_001077f8:
      msg = "not a file type in feof";
LAB_0010782c:
      mark(msg);
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar2 = y->r;
    piVar4 = (instrStruct *)calloc(1,0x10);
    piVar4->instr = iVar2 * 0x210000 + -0x34000000;
    piVar4->next = lastInstr->next;
    lastInstr->next = piVar4;
    pc = pc + 1;
    iVar5 = 0x3c;
    lastInstr = piVar4;
    goto LAB_00107643;
  case 5:
    ptVar3 = getType(fileTypeIndex);
    if (ptVar3->refIndex != y->typeIndex) goto LAB_001077f8;
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar2 = y->r;
    piVar4 = (instrStruct *)calloc(1,0x10);
    piVar4->instr = iVar2 * 0x210000 + -0x34000000;
    piVar4->next = lastInstr->next;
    lastInstr->next = piVar4;
    pc = pc + 1;
    iVar5 = 0x3d;
    lastInstr = piVar4;
LAB_00107643:
    put(iVar5,0x1c,0,iVar2);
    break;
  case 6:
    if (ptVar3->index != charTypeIndex) {
      msg = "ord only for char";
      goto LAB_0010782c;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar2 = y->r;
    put(0x35,0x1c,0,iVar2);
    y->typeIndex = intTypeIndex;
    break;
  default:
    goto switchD_00107412_default;
  }
  regs[iVar2] = 0;
switchD_00107412_default:
  return;
}

Assistant:

procedure 
void IOCall(struct item *x, struct item *y) {
	variable struct typeDesc *type;
	variable int r; r = 0;
	type = getType(y->typeIndex);
	/* writeChar */
	if (x->a == 0) {
		if (type->index != charTypeIndex) {
			mark("not a char in writeChar");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRC,0,0,y->r);
		regs[y->r] = 0;

	/* writeInt */
	} elsif (x->a == 1) {
		if (type->index != intTypeIndex) {
			mark("not an int in writeInt");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRI,0,0,y->r);
		regs[y->r]=0;

	/* handle fopen */
	} elsif (x->a == 2) {
		put(RISC_ALL,rv,0,wordSize); 
		r = getReg();

		/* if form is string literal, then addy is on heap */
		if (type->form == FORM_STRLIT) {
			put(RISC_HFOPEN,r,y->r,y->a);
		} elsif (type->form == FORM_ARRAY) {
			if (y->hs != 0) {
				r = getReg();
				put(RISC_BEQ,y->hs,0,3); 
				put(RISC_SFOPEN,r,y->r,y->a);
				put(RISC_BEQ,0,0,2);
				put(RISC_HFOPEN,r,y->r,y->a);
				regs[x->hs] = 0;
			} else {
				put(RISC_SFOPEN,r,y->r,y->a);
			}
		} else {
			mark("bad type in fopen");
			exit(-1);
		}
		put(RISC_HSTW,r,rv,0);
		regs[y->r] = 0;
		regs[r] = 0;

	/* handle fclose */
	} elsif (x->a == 3) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in fclose");
			exit(-1);

		/* load fd in register and close (fd is on heap) */
		} else {
			r = getReg();
			put(RISC_LDW,r,y->r,y->a);
			put(RISC_HLDW,r,r,0);
			put(RISC_FCLOSE,rv,0,r);
			regs[r] = 0;
		}
	
	/* handle feof */
	} elsif (x->a == 4) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FEOF,rv,0,r);
			regs[r] = 0;
		}

	/* handle fgetc */
	} elsif (x->a == 5) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FGETC,rv,0,r);
			regs[r] = 0;
		}
	} elsif (x->a == 6) {
		if (type->index != charTypeIndex) {
			mark("ord only for char");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_ORD,rv,0,r);
			y->typeIndex = intTypeIndex;
			regs[r] = 0;
		}
	}
}